

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>const,int_const&,int_const*>,std::_Rb_tree_const_iterator<int>>
          (base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
           *this,btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
                 tree_iter,_Rb_tree_const_iterator<int> checker_iter)

{
  bool bVar1;
  reference x;
  reference y;
  const_iterator cVar2;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  bVar3;
  _Self local_60;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *local_58;
  int local_50;
  const_iterator local_48;
  base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
  *local_38;
  base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *this_local;
  _Rb_tree_const_iterator<int> checker_iter_local;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  tree_iter_local;
  
  checker_iter_local._M_node = (_Base_ptr)tree_iter.node;
  bVar3.position = tree_iter.position;
  local_38 = this;
  this_local = (base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)checker_iter._M_node;
  cVar2 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
          ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                 *)this);
  local_58 = cVar2.node;
  local_50 = cVar2.position;
  local_48.node = local_58;
  local_48.position = local_50;
  bVar1 = btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
          ::operator==((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
                        *)&checker_iter_local,&local_48);
  if (bVar1) {
    local_60._M_node =
         (_Base_ptr)
         std::multiset<int,_std::less<int>,_std::allocator<int>_>::end
                   ((multiset<int,_std::less<int>,_std::allocator<int>_> *)(this + 0x20));
    bVar1 = std::operator==((_Self *)&this_local,&local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_multiset<int>, std::multiset<int>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_multiset<int>, CheckerType = std::multiset<int>, IterType = phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>, const int &, const int *>, CheckerIterType = std::_Rb_tree_const_iterator<int>]"
                   );
    }
  }
  else {
    x = btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
        ::operator*((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
                     *)&checker_iter_local);
    y = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)&this_local);
    (anonymous_namespace)::CheckPairEquals<int,int>(x,y);
  }
  bVar3.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)checker_iter_local._M_node;
  bVar3._12_4_ = 0;
  return bVar3;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }